

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-s-parser.cpp
# Opt level: O3

void __thiscall
wasm::SExpressionWasmBuilder::parseElem(SExpressionWasmBuilder *this,Element *s,Table *table)

{
  pointer *ppNVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  iterator iVar5;
  pointer puVar6;
  _Head_base<0UL,_wasm::Table_*,_false> _Var7;
  bool bVar8;
  bool bVar9;
  Const *pCVar10;
  ElementSegment *pEVar11;
  Element *pEVar12;
  Element *pEVar13;
  List *pLVar14;
  Expression *pEVar15;
  Type TVar16;
  string *psVar17;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> __ptr;
  default_delete<wasm::ElementSegment> *this_00;
  Index i;
  IString str;
  IString str_00;
  IString IVar18;
  string_view sVar19;
  anon_union_16_5_9943fe1e_for_Literal_0 local_c0;
  undefined8 local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  long local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  string_view local_50;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_40;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  
  iVar2 = this->elemCounter;
  this->elemCounter = iVar2 + 1;
  local_50 = (string_view)Name::fromInt((long)iVar2);
  if (table != (Table *)0x0) {
    local_68 = s;
    pCVar10 = (Const *)MixedArena::allocSpace(this->allocator,0x28,8);
    (pCVar10->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression._id = ConstId;
    (pCVar10->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.type.id = 0;
    (pCVar10->value).field_0.i64 = 0;
    (pCVar10->value).field_0.func.super_IString.str._M_str = (char *)0x0;
    (pCVar10->value).type.id = 0;
    local_c0.i32 = 0;
    local_b0 = 2;
    pCVar10 = Const::set(pCVar10,(Literal *)&local_c0.func);
    Literal::~Literal((Literal *)&local_c0.func);
    pEVar11 = (ElementSegment *)operator_new(0x50);
    sVar3 = (table->super_Importable).super_Named.name.super_IString.str._M_len;
    pcVar4 = (table->super_Importable).super_Named.name.super_IString.str._M_str;
    wasm::Type::Type((Type *)&local_38,(HeapType)0x1,Nullable);
    (pEVar11->table).super_IString.str._M_len = sVar3;
    (pEVar11->table).super_IString.str._M_str = pcVar4;
    pEVar11->offset = (Expression *)pCVar10;
    (pEVar11->type).id = (uintptr_t)local_38._M_head_impl;
    (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (pEVar11->super_Named).name.super_IString.str._M_len = local_50._M_len;
    (pEVar11->super_Named).name.super_IString.str._M_str = local_50._M_str;
    (pEVar11->super_Named).hasExplicitName = false;
    iVar5._M_current =
         (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    local_40._M_head_impl = pEVar11;
    if (iVar5._M_current ==
        (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
                ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->elemSegmentNames,iVar5,
                 (Name *)&local_50);
    }
    else {
      ((iVar5._M_current)->super_IString).str._M_len = local_50._M_len;
      ((iVar5._M_current)->super_IString).str._M_str = local_50._M_str;
      ppNVar1 = &(this->elemSegmentNames).
                 super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    pEVar12 = local_68;
    pEVar13 = Element::operator[](local_68,1);
    parseElemFinish(this,pEVar12,
                    (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
                    &local_40,1,pEVar13->isList_);
    if (local_40._M_head_impl == (ElementSegment *)0x0) {
      return;
    }
    this_00 = (default_delete<wasm::ElementSegment> *)&local_40;
    __ptr._M_head_impl = local_40._M_head_impl;
    goto LAB_0098ea2c;
  }
  i = 1;
  pEVar12 = Element::operator[](s,1);
  if (pEVar12->isList_ == false) {
    pEVar12 = Element::operator[](s,1);
    bVar9 = false;
    if ((pEVar12->isList_ == false) && (bVar9 = false, (pEVar12->dollared_ & 1U) != 0)) {
      pEVar12 = Element::operator[](s,1);
      local_50 = (string_view)Element::str(pEVar12);
      i = 2;
      bVar9 = true;
    }
  }
  else {
    bVar9 = false;
  }
  iVar5._M_current =
       (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar5._M_current ==
      (this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wasm::Name,std::allocator<wasm::Name>>::_M_realloc_insert<wasm::Name_const&>
              ((vector<wasm::Name,std::allocator<wasm::Name>> *)&this->elemSegmentNames,iVar5,
               (Name *)&local_50);
  }
  else {
    ((iVar5._M_current)->super_IString).str._M_len = local_50._M_len;
    ((iVar5._M_current)->super_IString).str._M_str = local_50._M_str;
    ppNVar1 = &(this->elemSegmentNames).super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppNVar1 = *ppNVar1 + 1;
  }
  pEVar12 = Element::operator[](s,i);
  if (pEVar12->isList_ == false) {
    pEVar12 = Element::operator[](s,i);
    IVar18 = Element::str(pEVar12);
    if (IVar18.str._M_str == _ZN4wasmL7DECLAREE_1) {
      return;
    }
  }
  pEVar11 = (ElementSegment *)operator_new(0x50);
  (pEVar11->super_Named).name.super_IString.str._M_len = 0;
  (pEVar11->super_Named).name.super_IString.str._M_str = (char *)0x0;
  *(undefined8 *)&(pEVar11->super_Named).hasExplicitName = 0;
  (pEVar11->table).super_IString.str._M_len = 0;
  (pEVar11->table).super_IString.str._M_str = (char *)0x0;
  pEVar11->offset = (Expression *)0x0;
  (pEVar11->type).id = 0;
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Type::Type(&pEVar11->type,(HeapType)0x1,Nullable);
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pEVar11->data).super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pEVar11->super_Named).name.super_IString.str._M_len = local_50._M_len;
  (pEVar11->super_Named).name.super_IString.str._M_str = local_50._M_str;
  (pEVar11->super_Named).hasExplicitName = bVar9;
  local_38._M_head_impl = pEVar11;
  pEVar12 = Element::operator[](s,i);
  bVar9 = true;
  if (pEVar12->isList_ == true) {
    pEVar12 = Element::operator[](s,i);
    IVar18.str._M_str = extraout_RDX;
    IVar18.str._M_len = DAT_00da7f70;
    bVar8 = elementStartsWith(pEVar12,IVar18);
    if (!bVar8) {
      pEVar12 = Element::operator[](s,i);
      str.str._M_str = extraout_RDX_00;
      str.str._M_len = DAT_00da7f00;
      bVar9 = elementStartsWith(pEVar12,str);
      if (bVar9) {
        pEVar12 = Element::operator[](s,i);
        pEVar12 = Element::operator[](pEVar12,1);
        sVar19 = (string_view)getTableName(this,pEVar12);
        i = i + 1;
        ((local_38._M_head_impl)->table).super_IString.str = sVar19;
      }
      pEVar12 = Element::operator[](s,i);
      str_00.str._M_str = extraout_RDX_01;
      str_00.str._M_len = _ZN4wasmL6OFFSETE_1;
      bVar9 = elementStartsWith(pEVar12,str_00);
      if (bVar9) {
        pLVar14 = Element::list(pEVar12);
        if (2 < (pLVar14->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).
                usedElements) {
          psVar17 = (string *)__cxa_allocate_exception(0x30);
          local_a8 = local_98;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,"Invalid offset for an element segment.","");
          local_68._0_4_ = (undefined4)s->line;
          local_68._4_4_ = *(undefined4 *)((long)&s->line + 4);
          uStack_60 = (undefined4)s->col;
          uStack_5c = *(undefined4 *)((long)&s->col + 4);
          *(string **)psVar17 = psVar17 + 0x10;
          std::__cxx11::string::_M_construct<char*>(psVar17,local_a8,local_a8 + local_a0);
          *(undefined4 *)(psVar17 + 0x20) = (undefined4)local_68;
          *(undefined4 *)(psVar17 + 0x24) = local_68._4_4_;
          *(undefined4 *)(psVar17 + 0x28) = uStack_60;
          *(undefined4 *)(psVar17 + 0x2c) = uStack_5c;
          __cxa_throw(psVar17,&ParseException::typeinfo,ParseException::~ParseException);
        }
        pEVar12 = Element::operator[](pEVar12,1);
      }
      pEVar15 = parseExpression(this,pEVar12);
      i = i + 1;
      (local_38._M_head_impl)->offset = pEVar15;
      bVar9 = false;
    }
  }
  pLVar14 = Element::list(s);
  if (((ulong)i <
       (pLVar14->super_ArenaVectorBase<ArenaVector<wasm::Element_*>,_wasm::Element_*>).usedElements)
     && (((pEVar12 = Element::operator[](s,i), pEVar12->isList_ != false ||
          (pEVar12 = Element::operator[](s,i), pEVar12->isList_ != false)) ||
         ((pEVar12->dollared_ & 1U) == 0)))) {
    pEVar12 = Element::operator[](s,i);
    if (pEVar12->isList_ == false) {
      pEVar12 = Element::operator[](s,i);
      IVar18 = Element::str(pEVar12);
      if (IVar18.str._M_str == DAT_00da7e80) {
        i = i + 1;
        goto LAB_0098e9c5;
      }
    }
    pEVar12 = Element::operator[](s,i);
    TVar16 = elementToType(this,pEVar12);
    ((local_38._M_head_impl)->type).id = TVar16.id;
    i = i + 1;
    bVar8 = true;
  }
  else {
LAB_0098e9c5:
    bVar8 = false;
  }
  if ((!bVar9) && (((local_38._M_head_impl)->table).super_IString.str._M_str == (char *)0x0)) {
    puVar6 = (this->wasm->tables).
             super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (puVar6 == (this->wasm->tables).
                  super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      psVar17 = (string *)__cxa_allocate_exception(0x30);
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_88,"active element without table","");
      local_68._0_4_ = (undefined4)s->line;
      local_68._4_4_ = *(undefined4 *)((long)&s->line + 4);
      uStack_60 = (undefined4)s->col;
      uStack_5c = *(undefined4 *)((long)&s->col + 4);
      *(string **)psVar17 = psVar17 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar17,local_88,local_88 + local_80);
      *(undefined4 *)(psVar17 + 0x20) = (undefined4)local_68;
      *(undefined4 *)(psVar17 + 0x24) = local_68._4_4_;
      *(undefined4 *)(psVar17 + 0x28) = uStack_60;
      *(undefined4 *)(psVar17 + 0x2c) = uStack_5c;
      __cxa_throw(psVar17,&ParseException::typeinfo,ParseException::~ParseException);
    }
    _Var7._M_head_impl =
         (puVar6->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
         super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    pcVar4 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 8);
    ((local_38._M_head_impl)->table).super_IString.str._M_len =
         *(size_t *)&(_Var7._M_head_impl)->super_Importable;
    ((local_38._M_head_impl)->table).super_IString.str._M_str = pcVar4;
  }
  bVar9 = true;
  if (!bVar8) {
    bVar9 = TableUtils::usesExpressions(local_38._M_head_impl,this->wasm);
  }
  parseElemFinish(this,s,(unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                          *)&local_38,i,bVar9);
  if (local_38._M_head_impl == (ElementSegment *)0x0) {
    return;
  }
  this_00 = (default_delete<wasm::ElementSegment> *)&local_38;
  __ptr._M_head_impl = local_38._M_head_impl;
LAB_0098ea2c:
  std::default_delete<wasm::ElementSegment>::operator()(this_00,__ptr._M_head_impl);
  return;
}

Assistant:

void SExpressionWasmBuilder::parseElem(Element& s, Table* table) {
  Index i = 1;
  Name name = Name::fromInt(elemCounter++);
  bool hasExplicitName = false;
  bool isPassive = true;
  bool usesExpressions = false;

  if (table) {
    Expression* offset = allocator.alloc<Const>()->set(Literal(int32_t(0)));
    auto segment = std::make_unique<ElementSegment>(table->name, offset);
    segment->setName(name, hasExplicitName);
    elemSegmentNames.push_back(name);
    parseElemFinish(s, segment, i, s[i]->isList());
    return;
  }

  if (s[i]->isStr() && s[i]->dollared()) {
    name = s[i++]->str();
    hasExplicitName = true;
  }
  elemSegmentNames.push_back(name);
  if (s[i]->isStr() && s[i]->str() == DECLARE) {
    // We don't store declared segments in the IR
    return;
  }

  auto segment = std::make_unique<ElementSegment>();
  segment->setName(name, hasExplicitName);

  if (s[i]->isList() && !elementStartsWith(s[i], REF)) {
    // Optional (table <tableidx>)
    if (elementStartsWith(s[i], TABLE)) {
      auto& inner = *s[i++];
      segment->table = getTableName(*inner[1]);
    }

    // Offset expression (offset (<expr>)) | (<expr>)
    auto& inner = *s[i++];
    if (elementStartsWith(inner, OFFSET)) {
      if (inner.size() > 2) {
        throw ParseException(
          "Invalid offset for an element segment.", s.line, s.col);
      }
      segment->offset = parseExpression(inner[1]);
    } else {
      segment->offset = parseExpression(inner);
    }
    isPassive = false;
  }

  if (i < s.size()) {
    if (s[i]->isStr() && s[i]->dollared()) {
      usesExpressions = false;
    } else if (s[i]->isStr() && s[i]->str() == FUNC) {
      usesExpressions = false;
      i += 1;
    } else {
      segment->type = elementToType(*s[i]);
      usesExpressions = true;
      i += 1;
    }
  }

  if (!isPassive && segment->table.isNull()) {
    if (wasm.tables.empty()) {
      throw ParseException("active element without table", s.line, s.col);
    }
    table = wasm.tables.front().get();
    segment->table = table->name;
  }

  // We may be post-MVP also due to type reasons or otherwise, as detected by
  // the utility function for Binaryen IR.
  usesExpressions =
    usesExpressions || TableUtils::usesExpressions(segment.get(), &wasm);

  parseElemFinish(s, segment, i, usesExpressions);
}